

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  const_iterator cVar11;
  ostream *poVar12;
  undefined7 in_register_00000011;
  undefined1 uVar13;
  _Base_ptr p_Var14;
  _Alloc_hider __s;
  cmCacheManager *pcVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string helpString;
  string entryKey;
  CacheEntry e;
  string buffer;
  string cacheFile;
  ostringstream error;
  ifstream fin;
  string local_4f0;
  cmCacheManager *local_4d0;
  string local_4c8;
  uint local_4a4;
  string local_4a0;
  CacheEntry local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_418;
  string *local_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_408;
  string local_400;
  undefined1 local_3e0 [32];
  _Base_ptr local_3c0;
  _Base_ptr local_3b8;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  undefined8 local_390;
  char *local_388;
  size_type local_380;
  pointer local_378;
  undefined8 local_370;
  char *local_368;
  ios_base local_340 [264];
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined8 local_228;
  char *local_220;
  byte abStack_218 [488];
  
  local_238._M_str = (path->_M_dataplus)._M_p;
  local_238._M_len = path->_M_string_length;
  local_228 = 0xf;
  local_220 = "/CMakeCache.txt";
  views._M_len = 2;
  views._M_array = &local_238;
  cmCatViews_abi_cxx11_((string *)local_3e0,views);
  if ((int)CONCAT71(in_register_00000011,internal) != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             *)this);
  }
  pcVar15 = (cmCacheManager *)local_3e0;
  bVar5 = cmsys::SystemTools::FileExists((string *)pcVar15);
  if (bVar5) {
    local_4d0 = this;
    std::ifstream::ifstream(&local_238,(char *)local_3e0._0_8_,_S_in);
    bVar5 = (abStack_218[*(long *)(local_238._M_len - 0x18)] & 5) == 0;
    uVar7 = CONCAT71((int7)((ulong)this >> 8),bVar5);
    if (bVar5) {
      local_4a4 = (uint)uVar7;
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      local_400._M_string_length = 0;
      local_400.field_2._M_local_buf[0] = '\0';
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      local_4a0._M_string_length = 0;
      local_4a0.field_2._M_local_buf[0] = '\0';
      local_418 = &includes->_M_t;
      local_410 = path;
      local_408 = &excludes->_M_t;
      if ((abStack_218[*(long *)(local_238._M_len - 0x18)] & 5) == 0) {
        local_3b8 = &(excludes->_M_t)._M_impl.super__Rb_tree_header._M_header;
        local_3c0 = &(includes->_M_t)._M_impl.super__Rb_tree_header._M_header;
LAB_00422031:
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        local_4c8._M_string_length = 0;
        local_4c8.field_2._M_local_buf[0] = '\0';
        local_480.Value._M_dataplus._M_p = (pointer)&local_480.Value.field_2;
        local_480.Value._M_string_length = 0;
        local_480.Value.field_2._M_local_buf[0] = '\0';
        local_480.Type = UNINITIALIZED;
        local_480.Properties.Map_._M_h._M_buckets = &local_480.Properties.Map_._M_h._M_single_bucket
        ;
        local_480.Properties.Map_._M_h._M_bucket_count = 1;
        local_480.Properties.Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_480.Properties.Map_._M_h._M_element_count = 0;
        local_480.Properties.Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_480.Initialized = false;
        local_480.Properties.Map_._M_h._M_rehash_policy._M_next_resize = 0;
        local_480.Properties.Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&local_238,&local_400,(bool *)0x0,0xffffffffffffffff);
        for (__s._M_p = local_400._M_dataplus._M_p; uVar7 = (ulong)(byte)*__s._M_p, uVar7 < 0x30;
            __s._M_p = __s._M_p + 1) {
          if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00422523;
            if (uVar7 == 0x2f) goto LAB_00422107;
            break;
          }
        }
        goto LAB_0042216b;
      }
LAB_00422588:
      pcVar15 = local_4d0;
      local_4d0->CacheMajorVersion = 0;
      local_4d0->CacheMinorVersion = 0;
      local_3b0._0_8_ = &local_3a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                       *)pcVar15,(key_type *)local_3b0);
      p_Var1 = &(pcVar15->Cache)._M_t._M_impl.super__Rb_tree_header;
      if (((_Rb_tree_header *)cVar11._M_node == p_Var1) ||
         ((char)cVar11._M_node[5]._M_color == _S_red)) {
        p_Var14 = (_Base_ptr)0x0;
      }
      else {
        p_Var14 = cVar11._M_node + 2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._0_8_ != &local_3a0) {
        operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
      }
      if (p_Var14 == (_Base_ptr)0x0) {
        local_3b0._0_8_ = &local_3a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
        AddCacheEntry(pcVar15,(string *)local_3b0,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._0_8_ != &local_3a0) {
          operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
        }
        local_3b0._0_8_ = &local_3a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
        AddCacheEntry(pcVar15,(string *)local_3b0,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._0_8_ != &local_3a0) {
          operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
        }
      }
      else {
        local_480.Value._M_dataplus._M_p = local_480.Value._M_dataplus._M_p & 0xffffffff00000000;
        iVar6 = __isoc99_sscanf(*(undefined8 *)p_Var14,"%u");
        if (iVar6 == 1) {
          pcVar15->CacheMajorVersion = (uint)local_480.Value._M_dataplus._M_p;
        }
        local_3b0._0_8_ = &local_3a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                         *)pcVar15,(key_type *)local_3b0);
        if (((_Rb_tree_header *)cVar11._M_node == p_Var1) ||
           ((char)cVar11._M_node[5]._M_color == _S_red)) {
          p_Var14 = (_Base_ptr)0x0;
        }
        else {
          p_Var14 = cVar11._M_node + 2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._0_8_ != &local_3a0) {
          operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
        }
        if (p_Var14 != (_Base_ptr)0x0) {
          iVar6 = __isoc99_sscanf(*(undefined8 *)p_Var14,"%u",&local_480);
          if (iVar6 == 1) {
            pcVar15->CacheMinorVersion = (uint)local_480.Value._M_dataplus._M_p;
          }
        }
      }
      local_3b0._0_8_ = &local_3a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"CMAKE_CACHEFILE_DIR","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                       *)pcVar15,(key_type *)local_3b0);
      if (((_Rb_tree_header *)cVar11._M_node == p_Var1) ||
         ((char)cVar11._M_node[5]._M_color == _S_red)) {
        p_Var14 = (_Base_ptr)0x0;
      }
      else {
        p_Var14 = cVar11._M_node + 2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._0_8_ != &local_3a0) {
        operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
      }
      if (internal && p_Var14 != (_Base_ptr)0x0) {
        paVar3 = &local_480.Value.field_2;
        pcVar4 = (local_410->_M_dataplus)._M_p;
        local_480.Value._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_480,pcVar4,pcVar4 + local_410->_M_string_length);
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c8,*(long *)p_Var14,
                   (long)&p_Var14->_M_parent->_M_color + *(long *)p_Var14);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_480.Value);
        std::__cxx11::string::append((char *)&local_480);
        std::__cxx11::string::append((char *)&local_4c8);
        bVar5 = cmsys::SystemTools::SameFile(&local_4c8,&local_480.Value);
        if (!bVar5) {
          local_3b0._0_8_ = &local_3a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b0,"CMAKE_CACHEFILE_DIR","");
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                           *)local_4d0,(key_type *)local_3b0);
          if (((_Rb_tree_header *)cVar11._M_node == p_Var1) ||
             ((char)cVar11._M_node[5]._M_color == _S_red)) {
            p_Var14 = (_Base_ptr)0x0;
          }
          else {
            p_Var14 = cVar11._M_node + 2;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._0_8_ != &local_3a0) {
            operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"The current CMakeCache.txt directory ",0x25);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b0,local_480.Value._M_dataplus._M_p,
                               local_480.Value._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," is different than the directory ",0x21);
          paVar2 = &local_4f0.field_2;
          local_4f0._M_dataplus._M_p = (pointer)paVar2;
          if (p_Var14 == (_Base_ptr)0x0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"");
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4f0,*(long *)p_Var14,
                       (long)&p_Var14->_M_parent->_M_color + *(long *)p_Var14);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,0x8f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != paVar2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_4f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != paVar2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,
                          CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,
                                   local_4c8.field_2._M_local_buf[0]) + 1);
        }
        pcVar15 = local_4d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480.Value._M_dataplus._M_p != paVar3) {
          operator_delete(local_480.Value._M_dataplus._M_p,
                          CONCAT71(local_480.Value.field_2._M_allocated_capacity._1_7_,
                                   local_480.Value.field_2._M_local_buf[0]) + 1);
        }
      }
      pcVar15->CacheLoaded = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = (ulong)local_4a4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,
                        CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                 local_400.field_2._M_local_buf[0]) + 1);
      }
    }
    uVar13 = (undefined1)uVar7;
    std::ifstream::~ifstream(&local_238);
  }
  else {
    CleanCMakeFiles(pcVar15,path);
    uVar13 = 0;
  }
  if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
  }
  return (bool)uVar13;
  while( true ) {
    if ((__s._M_p[2] == 0x5c) && (__s._M_p[3] == 0x6e)) {
      std::__cxx11::string::push_back((char)&local_4c8);
    }
    std::__cxx11::string::append((char *)&local_4c8);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)&local_238,&local_400,(bool *)0x0,0xffffffffffffffff);
    __s._M_p = local_400._M_dataplus._M_p;
    if (*local_400._M_dataplus._M_p != 0x2f) break;
LAB_00422107:
    if (__s._M_p[1] != 0x2f) break;
  }
LAB_0042216b:
  local_3b0._0_8_ = &local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
  CacheEntry::SetProperty(&local_480,(string *)local_3b0,local_4c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._0_8_ != &local_3a0) {
    operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
  }
  local_3b0._0_8_ = &local_3a0;
  sVar8 = strlen(__s._M_p);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,__s._M_p,__s._M_p + sVar8);
  bVar5 = cmState::ParseCacheEntry((string *)local_3b0,&local_4a0,&local_480.Value,&local_480.Type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._0_8_ != &local_3a0) {
    operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
  }
  if (bVar5) {
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(local_408,&local_4a0);
    if (iVar9._M_node == local_3b8) {
      if ((!internal) && (local_480.Type == INTERNAL)) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(local_418,&local_4a0);
        if (iVar9._M_node == local_3c0) goto LAB_00422523;
      }
      if (!internal) {
        local_480.Type = INTERNAL;
        local_3b0._0_8_ = (pointer)0xd;
        local_3b0._8_8_ = "DO NOT EDIT, ";
        local_3a0._M_allocated_capacity = local_4a0._M_string_length;
        local_3a0._8_8_ = local_4a0._M_dataplus._M_p;
        local_390 = 0x42;
        local_388 = " loaded from external file.  To change this value edit this file: ";
        local_378 = (local_410->_M_dataplus)._M_p;
        local_380 = local_410->_M_string_length;
        local_370 = 0xf;
        local_368 = "/CMakeCache.txt";
        views_00._M_len = 5;
        views_00._M_array = (iterator)local_3b0;
        cmCatViews_abi_cxx11_(&local_4f0,views_00);
        std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        local_3b0._0_8_ = &local_3a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
        CacheEntry::SetProperty(&local_480,(string *)local_3b0,local_4c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._0_8_ != &local_3a0) {
          operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
        }
      }
      bVar5 = ReadPropertyEntry(local_4d0,&local_4a0,&local_480);
      if (!bVar5) {
        local_480.Initialized = true;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                  ::operator[](&local_4d0->Cache,&local_4a0);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        pmVar10->Type = local_480.Type;
        if (&local_480 != pmVar10) {
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pmVar10->Properties,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&local_480.Properties);
        }
        pmVar10->Initialized = local_480.Initialized;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Parse error in cache file ",0x1a);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(char *)local_3e0._0_8_,local_3e0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," on line ",9);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,". Offending entry: ",0x13);
    sVar8 = strlen(__s._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s._M_p,sVar8);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
LAB_00422523:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_480.Properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.Value._M_dataplus._M_p != &local_480.Value.field_2) {
    operator_delete(local_480.Value._M_dataplus._M_p,
                    CONCAT71(local_480.Value.field_2._M_allocated_capacity._1_7_,
                             local_480.Value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,
                    CONCAT71(local_4c8.field_2._M_allocated_capacity._1_7_,
                             local_4c8.field_2._M_local_buf[0]) + 1);
  }
  if ((abStack_218[*(long *)(local_238._M_len - 0x18)] & 5) != 0) goto LAB_00422588;
  goto LAB_00422031;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += '\n';
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = cmStrCat("DO NOT EDIT, ", entryKey,
                                  " loaded from external file.  "
                                  "To change this value edit this file: ",
                                  path, "/CMakeCache.txt");
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile << " on line "
            << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (cmValue cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (cmValue cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  cmValue oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      cmValue dir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  this->CacheLoaded = true;
  return true;
}